

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O2

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_EXP_Test<double>::Body
          (iu_FloatingpointTest_x_iutest_x_EXP_Test<double> *this)

{
  int *in_R9;
  int exp;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  exp = 0xb;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"exp","FloatType::kEXP",(char *)&exp,
             &iutest::floating_point<double>::kEXP,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
               ,0x36,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, EXP)
{
    typedef typename TestFixture::ftype FloatType;
    const int exp = static_cast<int>(log2(::std::numeric_limits<TypeParam>::max_exponent) + 1);
    IUTEST_EXPECT_EQ(exp, FloatType::kEXP);
}